

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraph.cpp
# Opt level: O1

void __thiscall
dg::LLVMDependenceGraph::handleInstruction
          (LLVMDependenceGraph *this,Value *val,LLVMNode *node,LLVMNode *prevNode)

{
  ControlEdgesT *this_00;
  Value VVar1;
  LLVMPointerAnalysis *pLVar2;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *pNVar3;
  pointer ppFVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  LLVMNode *pLVar8;
  raw_ostream *prVar9;
  size_t __n;
  raw_ostream *this_01;
  char *pcVar10;
  Function *pFVar11;
  LLVMDependenceGraph *pLVar12;
  int *piVar13;
  Function **function;
  pointer ppFVar14;
  undefined8 uVar15;
  long lVar16;
  _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
  *this_02;
  LLVMPointsToSetImpl *pLVar17;
  Value *pVVar18;
  long lVar19;
  Function **function_1;
  Function *callFunc;
  undefined1 auVar20 [16];
  StringRef Str;
  const_iterator __begin3;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> possibleFunctions;
  LLVMPointsToSet pts;
  const_iterator __end3;
  LLVMNode *local_70;
  const_iterator local_68;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> local_60;
  LLVMPointsToSetImpl *local_48;
  Value *local_40;
  const_iterator local_38;
  
  VVar1 = val[0x10];
  local_70 = node;
  if (val == (Value *)0x0 || VVar1 != (Value)0x53) {
    if (VVar1 != (Value)0x22) {
      if (val == (Value *)0x0 || (byte)VVar1 < 0x1b) {
        return;
      }
      if (VVar1 != (Value)0x3d) {
        if (VVar1 == (Value)0x3c) {
          if ((*(uint *)(val + 0x14) >> 0x1e & 1) == 0) {
            pVVar18 = val + -(ulong)(*(uint *)(val + 0x14) << 5);
          }
          else {
            pVVar18 = *(Value **)(val + -8);
          }
          pVVar18 = (Value *)llvm::Value::stripInBoundsOffsets
                                       (*(undefined8 *)pVVar18,
                                        llvm::function_ref<void(llvm::Value_const*)>::
                                        callback_fn<llvm::Value::stripInBoundsOffsets(llvm::function_ref<void(llvm::Value_const*)>)::_default_arg_1_::_lambda(llvm::Value_const*)_1_>
                                        ,&local_60);
          if (pVVar18[0x10] == (Value)0x3) {
            addFormalGlobal(this,pVVar18);
          }
          if ((*(uint *)(val + 0x14) >> 0x1e & 1) == 0) {
            lVar19 = (long)val - (ulong)(*(uint *)(val + 0x14) << 5);
          }
          else {
            lVar19 = *(long *)(val + -8);
          }
          uVar15 = *(undefined8 *)(lVar19 + 0x20);
          goto LAB_001104c4;
        }
        if (VVar1 != (Value)0x3b) {
          return;
        }
      }
      if ((*(uint *)(val + 0x14) >> 0x1e & 1) == 0) {
        pVVar18 = val + -(ulong)(*(uint *)(val + 0x14) << 5);
      }
      else {
        pVVar18 = *(Value **)(val + -8);
      }
      uVar15 = *(undefined8 *)pVVar18;
LAB_001104c4:
      pVVar18 = (Value *)llvm::Value::stripInBoundsOffsets
                                   (uVar15,llvm::function_ref<void(llvm::Value_const*)>::
                                           callback_fn<llvm::Value::stripInBoundsOffsets(llvm::function_ref<void(llvm::Value_const*)>)::_default_arg_1_::_lambda(llvm::Value_const*)_1_>
                                    ,&local_60);
      if (pVVar18[0x10] != (Value)0x3) {
        return;
      }
      addFormalGlobal(this,pVVar18);
      return;
    }
    pLVar8 = getOrCreateNoReturn(this);
    this_00 = &(pLVar8->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
               revControlDepEdges;
    local_60.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_70;
    pNVar3 = &local_70->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>;
    std::
    _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
    ::_M_insert_unique<dg::LLVMNode*const&>
              ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                *)this_00,(LLVMNode **)&local_60);
    local_60.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)pLVar8;
    std::
    _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
    ::_M_insert_unique<dg::LLVMNode*const&>
              ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                *)&pNVar3->controlDepEdges,(LLVMNode **)&local_60);
    if (prevNode == (LLVMNode *)0x0) {
      return;
    }
    this_02 = (_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
               *)&(prevNode->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                  controlDepEdges;
    local_60.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)prevNode;
    std::
    _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
    ::_M_insert_unique<dg::LLVMNode*const&>
              ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                *)this_00,(LLVMNode **)&local_60);
    local_60.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)pLVar8;
    goto LAB_00110887;
  }
  prVar9 = (raw_ostream *)llvm::Value::stripPointerCasts();
  callFunc = (Function *)0x0;
  if (prVar9[0x10] == (raw_ostream)0x0) {
    callFunc = (Function *)prVar9;
  }
  if (callFunc == (Function *)0x0) {
    if ((*(char *)(*(long *)(val + -0x20) + 0x10) != '\x17') &&
       (pLVar2 = this->PTA, pLVar2 != (LLVMPointerAnalysis *)0x0)) {
      (**(code **)(*(long *)pLVar2 + 8))(&local_48,pLVar2,prVar9);
      lVar19 = (**(code **)(*(long *)local_48 + 0x20))();
      if (lVar19 == 0) {
        this_01 = (raw_ostream *)llvm::errs();
        Str.Length = 0xf;
        Str.Data = "Had no PTA node";
        llvm::raw_ostream::operator<<(this_01,Str);
        if (prVar9[0x10] == (raw_ostream)0x0) {
          pcVar10 = (char *)llvm::Value::getName();
          llvm::raw_ostream::operator<<(this_01,pcVar10);
        }
        else {
          llvm::Value::print(prVar9,SUB81(this_01,0));
        }
        if (*(undefined1 **)(this_01 + 0x18) == *(undefined1 **)(this_01 + 0x20)) {
          llvm::raw_ostream::write((char *)this_01,0x1190f4);
        }
        else {
          **(undefined1 **)(this_01 + 0x20) = 10;
          *(long *)(this_01 + 0x20) = *(long *)(this_01 + 0x20) + 1;
        }
      }
      pLVar17 = local_48;
      if ((local_48 != (LLVMPointsToSetImpl *)0x0) &&
         (cVar5 = (**(code **)(*(long *)local_48 + 0x38))(local_48), cVar5 != '\0')) {
        pLVar17 = (LLVMPointsToSetImpl *)0x0;
      }
      local_38.impl = (LLVMPointsToSetImpl *)0x0;
      local_68.impl = pLVar17;
      bVar6 = LLVMPointsToSet::const_iterator::operator==(&local_68,&local_38);
      if (!bVar6) {
        local_40 = val + 0x40;
        do {
          pFVar11 = (Function *)(**(code **)(*(long *)local_68.impl + 0x48))();
          if (pFVar11 != (Function *)0x0 && pFVar11[0x10] == (Function)0x0) {
            if ((*(Function **)(pFVar11 + 0x48) == pFVar11 + 0x48) ||
               (bVar6 = llvmutils::callIsCompatible(pFVar11,(CallInst *)val,LOOSE), !bVar6)) {
              if (this->threads == true) {
                auVar20 = llvm::Value::getName();
                if ((auVar20._8_8_ == 0xe) &&
                   (*(long *)((long)auVar20._0_8_ + 6) == 0x6574616572635f64 &&
                    *auVar20._0_8_ == 0x5f64616572687470)) {
                  getCalledFunctions(&local_60,
                                     *(Value **)
                                      (local_40 + -(ulong)(uint)(*(int *)(val + 0x14) << 5)),
                                     this->PTA);
                  ppFVar4 = local_60.
                            super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  for (ppFVar14 = local_60.
                                  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start; ppFVar14 != ppFVar4;
                      ppFVar14 = ppFVar14 + 1) {
                    pFVar11 = *ppFVar14;
                    if (*(Function **)(pFVar11 + 0x48) != pFVar11 + 0x48) {
                      pLVar12 = buildSubgraph(this,local_70,pFVar11,true);
                      Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addSubgraph
                                (&local_70->
                                  super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>,
                                 pLVar12);
                    }
                  }
                  if (local_60.
                      super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_60.
                                    super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_60.
                                          super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_60.
                                          super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
              }
            }
            else {
              pLVar12 = buildSubgraph(this,local_70,pFVar11,false);
              Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addSubgraph
                        (&local_70->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>
                         ,pLVar12);
            }
          }
          (**(code **)(*(long *)local_68.impl + 0x40))();
          cVar5 = (**(code **)(*(long *)local_68.impl + 0x38))();
          if (cVar5 != '\0') {
            local_68.impl = (LLVMPointsToSetImpl *)0x0;
          }
          bVar6 = LLVMPointsToSet::const_iterator::operator==(&local_68,&local_38);
        } while (!bVar6);
      }
      if (local_48 != (LLVMPointsToSetImpl *)0x0) {
        (**(code **)(*(long *)local_48 + 0x58))();
      }
    }
  }
  else if (this->gather_callsites != (char *)0x0) {
    auVar20 = llvm::Value::getName();
    pcVar10 = this->gather_callsites;
    if (pcVar10 == (char *)0x0) {
      __n = 0;
    }
    else {
      __n = strlen(pcVar10);
    }
    if ((auVar20._8_8_ == __n) &&
       ((__n == 0 || (iVar7 = bcmp(auVar20._0_8_,pcVar10,__n), iVar7 == 0)))) {
      std::
      _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
      ::_M_insert_unique<dg::LLVMNode*const&>
                ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                  *)this->gatheredCallsites,&local_70);
    }
  }
  if ((callFunc != (Function *)0x0) && (*(Function **)(callFunc + 0x48) != callFunc + 0x48)) {
    pLVar12 = buildSubgraph(this,local_70,callFunc,false);
    Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addSubgraph
              (&local_70->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>,pLVar12);
  }
  lVar19 = *(long *)(val + -0x20);
  lVar16 = 0;
  if ((lVar19 != 0) && (*(char *)(lVar19 + 0x10) == '\0')) {
    lVar16 = lVar19;
  }
  if ((lVar16 == 0) || (*(long *)(lVar16 + 0x18) != *(long *)(val + 0x48))) {
    lVar16 = 0;
  }
  if ((lVar16 != 0) && ((*(byte *)(lVar16 + 0x17) & 0x10) != 0)) {
    auVar20 = llvm::Value::getName();
    piVar13 = auVar20._0_8_;
    if (auVar20._8_8_ == 7) {
      if (*(int *)((long)piVar13 + 3) == 0x636f6c6c && *piVar13 == 0x6c616572) goto LAB_001107b0;
    }
    else if ((auVar20._8_8_ == 6) &&
            (((short)piVar13[1] == 0x636f && *piVar13 == 0x6c6c616d ||
             ((short)piVar13[1] == 0x636f && *piVar13 == 0x6c6c6163)))) {
LAB_001107b0:
      addFormalParameter(this,val);
    }
  }
  if ((callFunc != (Function *)0x0) && (this->threads != false)) {
    auVar20 = llvm::Value::getName();
    if ((auVar20._8_8_ == 0xe) &&
       (*(long *)((long)auVar20._0_8_ + 6) == 0x6574616572635f64 &&
        *auVar20._0_8_ == 0x5f64616572687470)) {
      getCalledFunctions(&local_60,
                         *(Value **)(val + (0x40 - (ulong)(uint)(*(int *)(val + 0x14) << 5))),
                         this->PTA);
      for (ppFVar14 = local_60.
                      super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          ppFVar14 !=
          local_60.
          super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppFVar14 = ppFVar14 + 1) {
        pLVar12 = buildSubgraph(this,local_70,*ppFVar14,true);
        Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addSubgraph
                  (&local_70->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>,
                   pLVar12);
      }
      if (local_60.
          super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.
                        super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_60.
                              super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.
                              super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  local_60.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_70;
  this_02 = (_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
             *)&this->callNodes;
LAB_00110887:
  std::
  _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
  ::_M_insert_unique<dg::LLVMNode*const&>(this_02,(LLVMNode **)&local_60);
  return;
}

Assistant:

void LLVMDependenceGraph::handleInstruction(llvm::Value *val, LLVMNode *node,
                                            LLVMNode *prevNode) {
    using namespace llvm;

    if (CallInst *CInst = dyn_cast<CallInst>(val)) {
#if LLVM_VERSION_MAJOR >= 8
        Value *strippedValue = CInst->getCalledOperand()->stripPointerCasts();
#else
        Value *strippedValue = CInst->getCalledValue()->stripPointerCasts();
#endif
        Function *func = dyn_cast<Function>(strippedValue);
        // if func is nullptr, then this is indirect call
        // via function pointer. If we have the points-to information,
        // create the subgraph
        if (!func && !CInst->isInlineAsm() && PTA) {
            using namespace dg::pta;
            auto pts = PTA->getLLVMPointsTo(strippedValue);
            if (pts.empty()) {
                llvmutils::printerr("Had no PTA node", strippedValue);
            }
            for (const LLVMPointer &ptr : pts) {
                // vararg may introduce imprecision here, so we
                // must check that it is really pointer to a function
                Function *F = dyn_cast<Function>(ptr.value);
                if (!F)
                    continue;

                if (F->empty() || !llvmutils::callIsCompatible(F, CInst)) {
                    if (threads && F && F->getName() == "pthread_create") {
                        auto possibleFunctions = getCalledFunctions(
                                CInst->getArgOperand(2), PTA);
                        for (auto &function : possibleFunctions) {
                            if (!function->empty()) {
                                LLVMDependenceGraph *subg = buildSubgraph(
                                        node,
                                        const_cast<llvm::Function *>(function),
                                        true /*this is fork*/);
                                node->addSubgraph(subg);
                            }
                        }
                    } else {
                        // incompatible prototypes or the function
                        // is only declaration
                        continue;
                    }
                } else {
                    LLVMDependenceGraph *subg = buildSubgraph(node, F);
                    node->addSubgraph(subg);
                }
            }
        }

        if (func && gather_callsites &&
            func->getName().equals(gather_callsites)) {
            gatheredCallsites->insert(node);
        }

        if (is_func_defined(func)) {
            LLVMDependenceGraph *subg = buildSubgraph(node, func);
            node->addSubgraph(subg);
        }

        // if we allocate a memory in a function, we can pass
        // it to other functions, so it is like global.
        // We need it as parameter, so that if we define it,
        // we can add def-use edges from parent, through the parameter
        // to the definition
        if (isMemAllocationFunc(CInst->getCalledFunction()))
            addFormalParameter(val);

        if (threads && func && func->getName() == "pthread_create") {
            auto possibleFunctions =
                    getCalledFunctions(CInst->getArgOperand(2), PTA);
            for (auto &function : possibleFunctions) {
                auto *subg = buildSubgraph(
                        node, const_cast<llvm::Function *>(function),
                        true /*this is fork*/);
                node->addSubgraph(subg);
            }
        }

        // no matter what is the function, this is a CallInst,
        // so create call-graph
        addCallNode(node);
    } else if (isa<UnreachableInst>(val)) {
        auto *noret = getOrCreateNoReturn();
        node->addControlDependence(noret);
        // unreachable is being inserted because of the previous instr
        // aborts the program. This means that whether it is executed
        // depends on the previous instr
        if (prevNode)
            prevNode->addControlDependence(noret);
    } else if (Instruction *Inst = dyn_cast<Instruction>(val)) {
        if (isa<LoadInst>(val) || isa<GetElementPtrInst>(val)) {
            Value *op = Inst->getOperand(0)->stripInBoundsOffsets();
            if (isa<GlobalVariable>(op))
                addFormalGlobal(op);
        } else if (isa<StoreInst>(val)) {
            Value *op = Inst->getOperand(0)->stripInBoundsOffsets();
            if (isa<GlobalVariable>(op))
                addFormalGlobal(op);

            op = Inst->getOperand(1)->stripInBoundsOffsets();
            if (isa<GlobalVariable>(op))
                addFormalGlobal(op);
        }
    }
}